

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseInputCommand(WastParser *this,CommandPtr *param_1)

{
  bool bVar1;
  Result RVar2;
  Var local_120;
  undefined1 local_d8 [8];
  string text;
  Var var;
  undefined1 local_48 [8];
  Location loc;
  CommandPtr *param_1_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    RVar2 = Expect(this,Input);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Error(this,0x258086);
      Var::Var((Var *)((long)&text.field_2 + 8));
      std::__cxx11::string::string((string *)local_d8);
      Var::Var(&local_120);
      ParseVarOpt(this,(Var *)((long)&text.field_2 + 8),&local_120);
      Var::~Var(&local_120);
      RVar2 = ParseQuotedText(this,(string *)local_d8,true);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        RVar2 = Expect(this,Rpar);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      std::__cxx11::string::~string((string *)local_d8);
      Var::~Var((Var *)((long)&text.field_2 + 8));
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseInputCommand(CommandPtr*) {
  // Parse the input command, but always fail since this command is not
  // actually supported.
  WABT_TRACE(ParseInputCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Input);
  Error(loc, "input command is not supported");
  Var var;
  std::string text;
  ParseVarOpt(&var);
  CHECK_RESULT(ParseQuotedText(&text));
  EXPECT(Rpar);
  return Result::Error;
}